

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mersennetwister.h
# Opt level: O0

void __thiscall MTRand::seed(MTRand *this)

{
  int iVar1;
  size_t sVar2;
  time_t t;
  clock_t c;
  uint32 oneSeed;
  bool bVar3;
  int local_13a4;
  bool success;
  uint32 **ppuStack_13a0;
  int i;
  uint32 *s;
  uint32 bigSeed [624];
  FILE *urandom;
  MTRand *this_local;
  
  bigSeed[0x26f] = (uint32)fopen("/dev/urandom","rb");
  if ((FILE *)bigSeed[0x26f] != (FILE *)0x0) {
    local_13a4 = 0x270;
    bVar3 = true;
    ppuStack_13a0 = &s;
    while( true ) {
      iVar1 = local_13a4;
      if (bVar3) {
        local_13a4 = local_13a4 + -1;
      }
      if (!bVar3 || iVar1 == 0) break;
      sVar2 = fread(ppuStack_13a0,8,1,(FILE *)bigSeed[0x26f]);
      bVar3 = sVar2 != 0;
      ppuStack_13a0 = ppuStack_13a0 + 1;
    }
    fclose((FILE *)bigSeed[0x26f]);
    if (bVar3) {
      seed(this,(uint32 *)&s,0x270);
      return;
    }
  }
  t = time((time_t *)0x0);
  c = clock();
  oneSeed = hash(t,c);
  seed(this,oneSeed);
  return;
}

Assistant:

void MTRand::seed() {
  // Seed the generator with an array from /dev/urandom if available
  // Otherwise use a hash of time() and clock() values

  // First try getting an array from /dev/urandom
  FILE *urandom = fopen("/dev/urandom", "rb");
  if (urandom) {
    uint32 bigSeed[N];
    uint32 *s = bigSeed;
    int i = N;
    bool success = true;
    while (success && i--)
      success = fread(s++, sizeof(uint32), 1, urandom);
    fclose(urandom);
    if (success) {
      seed(bigSeed, N);
      return;
    }
  }

  // Was not successful, so use time() and clock() instead
  seed(hash(time(NULL), clock()));
}